

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzreadtetgen.cpp
# Opt level: O2

bool __thiscall
TPZReadTetGen::ProcessFaces
          (TPZReadTetGen *this,string *FaceFileName,TPZGeoMesh *gmesh,int64_t *numberfaces)

{
  istream *piVar1;
  mapped_type_conflict *pmVar2;
  int64_t i;
  long lVar3;
  int64_t mat;
  int64_t nfaces;
  int64_t BoundMarker;
  TPZManVector<long,_3> nodind;
  int64_t index;
  int64_t NO3;
  int64_t NO2;
  int64_t NO1;
  int64_t ID;
  ifstream FaceFile;
  
  std::ifstream::ifstream(&FaceFile,(FaceFileName->_M_dataplus)._M_p,_S_in);
  TPZManVector<long,_3>::TPZManVector(&nodind,3);
  piVar1 = std::istream::_M_extract<long>((long *)&FaceFile);
  std::istream::_M_extract<long>((long *)piVar1);
  *numberfaces = nfaces;
  for (lVar3 = 0; lVar3 < nfaces; lVar3 = lVar3 + 1) {
    piVar1 = std::istream::_M_extract<long>((long *)&FaceFile);
    piVar1 = std::istream::_M_extract<long>((long *)piVar1);
    piVar1 = std::istream::_M_extract<long>((long *)piVar1);
    std::istream::_M_extract<long>((long *)piVar1);
    if (BoundMarker == 0) {
      mat = -1;
    }
    else {
      std::istream::_M_extract<long>((long *)&FaceFile);
    }
    pmVar2 = std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
             operator[](&this->fNodeIndices,&NO1);
    *nodind.super_TPZVec<long>.fStore = *pmVar2;
    pmVar2 = std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
             operator[](&this->fNodeIndices,&NO2);
    nodind.super_TPZVec<long>.fStore[1] = *pmVar2;
    pmVar2 = std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
             operator[](&this->fNodeIndices,&NO3);
    nodind.super_TPZVec<long>.fStore[2] = *pmVar2;
    (*(gmesh->super_TPZSavable)._vptr_TPZSavable[0xc])(gmesh,2,&nodind,mat & 0xffffffff,&index,1);
  }
  TPZManVector<long,_3>::~TPZManVector(&nodind);
  std::ifstream::~ifstream(&FaceFile);
  return true;
}

Assistant:

bool TPZReadTetGen::ProcessFaces(std::string FaceFileName,  TPZGeoMesh &gmesh, int64_t & numberfaces){
	
	std::ifstream FaceFile(FaceFileName.c_str());
	
	int64_t nfaces, BoundMarker, ID, mat;
	int64_t NO1, NO2, NO3, index;
	TPZManVector<int64_t,3> nodind(3);
	//TPZGeoEl * gel;
	
	FaceFile >> nfaces >> BoundMarker;
	
	numberfaces = nfaces;
	
	for(int64_t i = 0; i < nfaces; i++){
		FaceFile >> ID >> NO1 >> NO2 >> NO3;
		if (BoundMarker) FaceFile >> mat;
		else mat = -1;
		nodind[0] = this->fNodeIndices[ NO1 ];
		nodind[1] = this->fNodeIndices[ NO2 ];
		nodind[2] = this->fNodeIndices[ NO3 ];
		/*gel = */gmesh.CreateGeoElement(ETriangle, nodind, mat, index);
	}//for i
	
	return true;
	
}